

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

void little2_updatePosition(ENCODING *enc,char *ptr,char *end,POSITION *pos)

{
  byte *pbVar1;
  uint local_3c;
  uint local_2c;
  POSITION *pos_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  end_local = ptr;
  while (1 < (long)end - (long)end_local) {
    if (end_local[1] == '\0') {
      local_2c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
    }
    else {
      local_2c = unicode_byte_type(end_local[1],*end_local);
    }
    switch(local_2c) {
    case 5:
      end_local = end_local + 2;
      pos->columnNumber = pos->columnNumber + 1;
      break;
    case 6:
      end_local = end_local + 3;
      pos->columnNumber = pos->columnNumber + 1;
      break;
    case 7:
      end_local = end_local + 4;
      pos->columnNumber = pos->columnNumber + 1;
      break;
    default:
      end_local = end_local + 2;
      pos->columnNumber = pos->columnNumber + 1;
      break;
    case 9:
      pos->lineNumber = pos->lineNumber + 1;
      pbVar1 = (byte *)(end_local + 2);
      if (1 < (long)end - (long)pbVar1) {
        if (end_local[3] == '\0') {
          local_3c = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar1);
        }
        else {
          local_3c = unicode_byte_type(end_local[3],*pbVar1);
        }
        if (local_3c == 10) {
          pbVar1 = (byte *)(end_local + 4);
        }
      }
      end_local = (char *)pbVar1;
      pos->columnNumber = 0;
      break;
    case 10:
      pos->columnNumber = 0;
      pos->lineNumber = pos->lineNumber + 1;
      end_local = end_local + 2;
    }
  }
  return;
}

Assistant:

static void PTRCALL
PREFIX(updatePosition)(const ENCODING *enc, const char *ptr, const char *end,
                       POSITION *pos) {
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    pos->columnNumber++;                                                       \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_LF:
      pos->columnNumber = 0;
      pos->lineNumber++;
      ptr += MINBPC(enc);
      break;
    case BT_CR:
      pos->lineNumber++;
      ptr += MINBPC(enc);
      if (HAS_CHAR(enc, ptr, end) && BYTE_TYPE(enc, ptr) == BT_LF)
        ptr += MINBPC(enc);
      pos->columnNumber = 0;
      break;
    default:
      ptr += MINBPC(enc);
      pos->columnNumber++;
      break;
    }
  }
}